

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::sremovevertex(tetgenmesh *this,point delpt,face *parentsh,face *parentseg,int lawson)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  point pdVar6;
  point pdVar7;
  shellface ppdVar8;
  point pdVar9;
  face *s;
  point pd_00;
  double dVar10;
  double dVar11;
  face *local_168;
  undefined1 local_160 [8];
  face fakesh;
  face adjseg2;
  face adjseg1;
  face checkseg;
  face prevseg;
  face abseg;
  face nextsh;
  face neighsh;
  face startsh;
  uint local_c8;
  int j;
  int i;
  int it;
  double ori2;
  double ori1;
  point pd;
  point pc;
  point pb;
  point pa;
  face *parysh;
  face spinsh;
  face flipfaces [4];
  int lawson_local;
  face *parentseg_local;
  face *parentsh_local;
  point delpt_local;
  tetgenmesh *this_local;
  
  local_168 = (face *)&spinsh.shver;
  do {
    face::face(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (face *)&flipfaces[3].shver);
  face::face((face *)&parysh);
  if (parentseg == (face *)0x0) {
    if (2 < this->b->verbose) {
      uVar2 = pointmark(this,delpt);
      printf("      Remove vertex %d from surface.\n",(ulong)uVar2);
    }
    senextself(this,parentsh);
    arraypool::newindex(this->cavesegshlist,&pa);
    face::operator=((face *)pa,parentsh);
  }
  else {
    face::face((face *)&neighsh.shver);
    face::face((face *)&nextsh.shver);
    face::face((face *)&abseg.shver);
    face::face((face *)&prevseg.shver);
    face::face((face *)&checkseg.shver);
    face::face((face *)&adjseg1.shver);
    face::face((face *)&adjseg2.shver);
    face::face((face *)&fakesh.shver);
    face::face((face *)local_160);
    senext2(this,parentseg,(face *)&checkseg.shver);
    spivotself(this,(face *)&checkseg.shver);
    prevseg.sh._0_4_ = 0;
    pdVar6 = sorg(this,(face *)&checkseg.shver);
    pdVar7 = sdest(this,parentseg);
    if (2 < this->b->verbose) {
      uVar2 = pointmark(this,delpt);
      uVar3 = pointmark(this,pdVar6);
      uVar4 = pointmark(this,pdVar7);
      printf("      Remove vertex %d from segment [%d, %d].\n",(ulong)uVar2,(ulong)uVar3,
             (ulong)uVar4);
    }
    makeshellface(this,this->subsegs,(face *)&prevseg.shver);
    setsorg(this,(face *)&prevseg.shver,pdVar6);
    setsdest(this,(face *)&prevseg.shver,pdVar7);
    setsapex(this,(face *)&prevseg.shver,(point)0x0);
    iVar5 = shellmark(this,parentseg);
    setshellmark(this,(face *)&prevseg.shver,iVar5);
    if (this->checkconstraints != 0) {
      dVar10 = areabound(this,parentseg);
      setareabound(this,(face *)&prevseg.shver,dVar10);
    }
    if (this->useinsertradius != 0) {
      iVar5 = getfacetindex(this,parentseg);
      setfacetindex(this,(face *)&prevseg.shver,iVar5);
    }
    senext2(this,(face *)&checkseg.shver,(face *)&adjseg2.shver);
    spivotself(this,(face *)&adjseg2.shver);
    if (adjseg2._8_8_ != 0) {
      adjseg1.sh._0_4_ = 0;
      senextself(this,(face *)&adjseg2.shver);
      senext2(this,(face *)&prevseg.shver,(face *)&fakesh.shver);
      sbond(this,(face *)&adjseg2.shver,(face *)&fakesh.shver);
    }
    senext(this,parentseg,(face *)&adjseg2.shver);
    spivotself(this,(face *)&adjseg2.shver);
    if (adjseg2._8_8_ != 0) {
      adjseg1.sh._0_4_ = 0;
      senext2self(this,(face *)&adjseg2.shver);
      senext(this,(face *)&prevseg.shver,(face *)&fakesh.shver);
      sbond(this,(face *)&adjseg2.shver,(face *)&fakesh.shver);
    }
    ppdVar8 = sencode(this,(face *)&prevseg.shver);
    setpoint2sh(this,pdVar6,ppdVar8);
    ppdVar8 = sencode(this,(face *)&prevseg.shver);
    setpoint2sh(this,pdVar7,ppdVar8);
    spivot(this,parentseg,parentsh);
    if (parentsh->sh != (shellface *)0x0) {
      face::operator=((face *)&parysh,parentsh);
      do {
        arraypool::newindex(this->caveshlist,&pa);
        face::operator=((face *)pa,(face *)&parysh);
        spivotself(this,(face *)&parysh);
        if (parysh == (face *)0x0) break;
      } while (parysh != (face *)parentsh->sh);
    }
    for (local_c8 = 0; (long)(int)local_c8 < this->caveshlist->objects; local_c8 = local_c8 + 1) {
      pa = (point)(this->caveshlist->toparray
                   [(int)local_c8 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
                  (int)((local_c8 & this->caveshlist->objectsperblockmark) *
                       this->caveshlist->objectbytes));
      face::operator=((face *)&neighsh.shver,(face *)pa);
      pdVar9 = sorg(this,(face *)&neighsh.shver);
      if (pdVar9 != delpt) {
        sesymself(this,(face *)&neighsh.shver);
      }
      face::operator=((face *)&nextsh.shver,(face *)&neighsh.shver);
      while( true ) {
        senext2self(this,(face *)&nextsh.shver);
        sspivot(this,(face *)&nextsh.shver,(face *)&adjseg1.shver);
        if (adjseg1._8_8_ != 0) break;
        spivotself(this,(face *)&nextsh.shver);
        pdVar9 = sorg(this,(face *)&nextsh.shver);
        if (pdVar9 != delpt) {
          sesymself(this,(face *)&nextsh.shver);
        }
      }
      if (nextsh._8_8_ == neighsh._8_8_) {
        senext2self(this,(face *)&nextsh.shver);
        spivot(this,(face *)&nextsh.shver,(face *)&neighsh.shver);
        pdVar9 = sorg(this,(face *)&neighsh.shver);
        if (pdVar9 != pdVar6) {
          sesymself(this,(face *)&neighsh.shver);
        }
        sdissolve(this,(face *)&neighsh.shver);
        ssbond(this,(face *)&neighsh.shver,(face *)&prevseg.shver);
        face::operator=((face *)local_160,(face *)&neighsh.shver);
        shellfacedealloc(this,this->subfaces,(shellface *)nextsh._8_8_);
      }
      else {
        ssdissolve(this,(face *)&neighsh.shver);
        ssdissolve(this,(face *)&nextsh.shver);
        makeshellface(this,this->subfaces,(face *)local_160);
        setsorg(this,(face *)local_160,pdVar6);
        setsdest(this,(face *)local_160,pdVar7);
        setsapex(this,(face *)local_160,delpt);
        iVar5 = shellmark(this,(face *)&neighsh.shver);
        setshellmark(this,(face *)local_160,iVar5);
        ssbond(this,(face *)local_160,(face *)&prevseg.shver);
        senext(this,(face *)local_160,(face *)&abseg.shver);
        sbond(this,(face *)&abseg.shver,(face *)&neighsh.shver);
        senext2(this,(face *)local_160,(face *)&abseg.shver);
        sbond(this,(face *)&abseg.shver,(face *)&nextsh.shver);
        smarktest(this,(face *)local_160);
      }
      arraypool::newindex(this->cavesegshlist,&pa);
      face::operator=((face *)pa,(face *)local_160);
    }
    arraypool::restart(this->caveshlist);
    if (1 < this->cavesegshlist->objects) {
      for (local_c8 = 0; (long)(int)local_c8 < this->cavesegshlist->objects; local_c8 = local_c8 + 1
          ) {
        pa = (point)(this->cavesegshlist->toparray
                     [(int)local_c8 >> ((byte)this->cavesegshlist->log2objectsperblock & 0x1f)] +
                    (int)((local_c8 & this->cavesegshlist->objectsperblockmark) *
                         this->cavesegshlist->objectbytes));
        face::operator=((face *)local_160,(face *)pa);
        uVar2 = (uint)((long)(int)(local_c8 + 1) % this->cavesegshlist->objects);
        pa = (point)(this->cavesegshlist->toparray
                     [(int)uVar2 >> ((byte)this->cavesegshlist->log2objectsperblock & 0x1f)] +
                    (int)((uVar2 & this->cavesegshlist->objectsperblockmark) *
                         this->cavesegshlist->objectbytes));
        face::operator=((face *)&abseg.shver,(face *)pa);
        sbond1(this,(face *)local_160,(face *)&abseg.shver);
      }
    }
    shellfacedealloc(this,this->subsegs,parentseg->sh);
    shellfacedealloc(this,this->subsegs,(shellface *)checkseg._8_8_);
    face::operator=(parentseg,(face *)&prevseg.shver);
  }
  j = 0;
  do {
    if (this->cavesegshlist->objects <= (long)j) {
      arraypool::restart(this->cavesegshlist);
      if (2 < this->b->verbose) {
        printf("      Created %ld new subfaces.\n",this->caveshbdlist->objects);
      }
      if (lawson != 0) {
        lawsonflip(this);
      }
      return 0;
    }
    s = (face *)(this->cavesegshlist->toparray
                 [j >> ((byte)this->cavesegshlist->log2objectsperblock & 0x1f)] +
                (j & this->cavesegshlist->objectsperblockmark) * this->cavesegshlist->objectbytes);
    senextself(this,s);
    spivotself(this,s);
    pdVar6 = sorg(this,s);
    if (pdVar6 != delpt) {
      sesymself(this,s);
    }
    pdVar6 = sorg(this,s);
    if (pdVar6 == delpt) {
      while( true ) {
        face::operator=((face *)&parysh,s);
        while( true ) {
          arraypool::newindex(this->caveshlist,&pa);
          face::operator=((face *)pa,(face *)&parysh);
          senext2self(this,(face *)&parysh);
          spivotself(this,(face *)&parysh);
          if (parysh == (face *)s->sh) break;
          pdVar6 = sorg(this,(face *)&parysh);
          if (pdVar6 != delpt) {
            sesymself(this,(face *)&parysh);
          }
        }
        if (this->caveshlist->objects == 3) break;
        for (local_c8 = 0; (long)(int)local_c8 < this->caveshlist->objects; local_c8 = local_c8 + 1)
        {
          pa = (point)(this->caveshlist->toparray
                       [(int)local_c8 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
                      (int)((local_c8 & this->caveshlist->objectsperblockmark) *
                           this->caveshlist->objectbytes));
          face::operator=((face *)&spinsh.shver,(face *)pa);
          spivot(this,(face *)&spinsh.shver,(face *)&flipfaces[0].shver);
          pdVar6 = sorg(this,(face *)&spinsh.shver);
          pdVar7 = sdest(this,(face *)&flipfaces[0].shver);
          if (pdVar6 != pdVar7) {
            sesymself(this,(face *)&flipfaces[0].shver);
          }
          bVar1 = smarktested(this,(face *)&spinsh.shver);
          if ((!bVar1) && (bVar1 = smarktested(this,(face *)&flipfaces[0].shver), !bVar1)) {
            pdVar6 = sorg(this,(face *)&spinsh.shver);
            pdVar7 = sdest(this,(face *)&spinsh.shver);
            pdVar9 = sapex(this,(face *)&spinsh.shver);
            pd_00 = sapex(this,(face *)&flipfaces[0].shver);
            calculateabovepoint4(this,pdVar6,pdVar7,pdVar9,pd_00);
            dVar10 = orient3d(pdVar9,pd_00,this->dummypoint,pdVar6);
            dVar11 = orient3d(pdVar9,pd_00,this->dummypoint,pdVar7);
            if (dVar10 * dVar11 < 0.0) {
              flip22(this,(face *)&spinsh.shver,lawson,0);
              senext2(this,(face *)&flipfaces[0].shver,s);
              arraypool::newindex(this->caveshbdlist,&pa);
              face::operator=((face *)pa,(face *)&spinsh.shver);
              break;
            }
          }
        }
        if ((long)(int)local_c8 == this->caveshlist->objects) {
          pa = (point)this->caveshlist->toparray
                      [0 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)];
          face::operator=((face *)&spinsh.shver,(face *)pa);
          spivot(this,(face *)&spinsh.shver,(face *)&flipfaces[0].shver);
          pdVar6 = sorg(this,(face *)&spinsh.shver);
          pdVar7 = sdest(this,(face *)&flipfaces[0].shver);
          if (pdVar6 != pdVar7) {
            sesymself(this,(face *)&flipfaces[0].shver);
          }
          flip22(this,(face *)&spinsh.shver,lawson,0);
          senext2(this,(face *)&flipfaces[0].shver,s);
          arraypool::newindex(this->caveshbdlist,&pa);
          face::operator=((face *)pa,(face *)&spinsh.shver);
        }
        arraypool::restart(this->caveshlist);
      }
      for (local_c8 = 0; (int)local_c8 < 3; local_c8 = local_c8 + 1) {
        pa = (point)(this->caveshlist->toparray
                     [(int)local_c8 >> ((byte)this->caveshlist->log2objectsperblock & 0x1f)] +
                    (int)((local_c8 & this->caveshlist->objectsperblockmark) *
                         this->caveshlist->objectbytes));
        face::operator=((face *)&flipfaces[(long)(int)local_c8 + -1].shver,(face *)pa);
      }
      flip31(this,(face *)&spinsh.shver,lawson);
      for (local_c8 = 0; (int)local_c8 < 3; local_c8 = local_c8 + 1) {
        shellfacedealloc(this,this->subfaces,
                         *(shellface **)&flipfaces[(long)(int)local_c8 + -1].shver);
      }
      arraypool::restart(this->caveshlist);
      arraypool::newindex(this->caveshbdlist,&pa);
      face::operator=((face *)pa,(face *)&flipfaces[2].shver);
    }
    j = j + 1;
  } while( true );
}

Assistant:

int tetgenmesh::sremovevertex(point delpt, face* parentsh, face* parentseg,
                              int lawson)
{
  face flipfaces[4], spinsh, *parysh;
  point pa, pb, pc, pd;
  REAL ori1, ori2;
  int it, i, j;

  if (parentseg != NULL) {
    // 'delpt' (p) should be a Steiner point inserted in a segment [a,b],
    //   where 'parentseg' should be [p,b]. Find the segment [a,p].
    face startsh, neighsh, nextsh;
    face abseg, prevseg, checkseg;
    face adjseg1, adjseg2;
    face fakesh;
    senext2(*parentseg, prevseg);
    spivotself(prevseg);
    prevseg.shver = 0;
    // Restore the original segment [a,b].
    pa = sorg(prevseg);
    pb = sdest(*parentseg);
    if (b->verbose > 2) {
      printf("      Remove vertex %d from segment [%d, %d].\n", 
             pointmark(delpt), pointmark(pa), pointmark(pb));
    }
    makeshellface(subsegs, &abseg);
    setshvertices(abseg, pa, pb, NULL);
    setshellmark(abseg, shellmark(*parentseg));
    if (checkconstraints) {
      setareabound(abseg, areabound(*parentseg));
    }
    if (useinsertradius) {
      setfacetindex(abseg, getfacetindex(*parentseg));
    }
    // Connect [#, a]<->[a, b].
    senext2(prevseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senextself(adjseg1);
      senext2(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Connect [a, b]<->[b, #].
    senext(*parentseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senext2self(adjseg1);
      senext(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Update the point-to-segment map.
    setpoint2sh(pa, sencode(abseg));
    setpoint2sh(pb, sencode(abseg));

    // Get the faces in face ring at segment [p, b].
    //   Re-use array 'caveshlist'.
    spivot(*parentseg, *parentsh);
    if (parentsh->sh != NULL) {
      spinsh = *parentsh;
      while (1) {
        // Save this face in list.
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        // Go to the next face in the ring.
        spivotself(spinsh);
        if (spinsh.sh == NULL) {
          break; // It is possible there is only one facet.
        }
        if (spinsh.sh == parentsh->sh) break;
      }
    }

    // Create the face ring of the new segment [a,b]. Each face in the ring
    //   is [a,b,p] (degenerated!). It will be removed (automatically).
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      startsh = *parysh;
      if (sorg(startsh) != delpt) {
        sesymself(startsh);
      }      
      // startsh is [p, b, #1], find the subface [a, p, #2].
      neighsh = startsh;
      while (1) {
        senext2self(neighsh);
        sspivot(neighsh, checkseg);
        if (checkseg.sh != NULL) {
          // It must be the segment [a, p].
          break;
        }
        spivotself(neighsh);
        if (sorg(neighsh) != delpt) sesymself(neighsh);
      }
      // Now neighsh is [a, p, #2].
      if (neighsh.sh != startsh.sh) {
        // Detach the two subsegments [a,p] and [p,b] from subfaces.
        ssdissolve(startsh);
        ssdissolve(neighsh);
        // Create a degenerated subface [a,b,p]. It is used to: (1) hold the
        //   new segment [a,b]; (2) connect to the two adjacent subfaces
        //   [p,b,#] and [a,p,#].
        makeshellface(subfaces, &fakesh);
        setshvertices(fakesh, pa, pb, delpt);
        setshellmark(fakesh, shellmark(startsh));
        // Connect fakesh to the segment [a,b].
        ssbond(fakesh, abseg);
        // Connect fakesh to adjacent subfaces: [p,b,#1] and [a,p,#2].
        senext(fakesh, nextsh);
        sbond(nextsh, startsh);
        senext2(fakesh, nextsh);
        sbond(nextsh, neighsh);
        smarktest(fakesh); // Mark it as faked.
      } else {
        // Special case. There exists already a degenerated face [a,b,p]!
        //   There is no need to create a faked subface here.
        senext2self(neighsh); // [a,b,p]
        // Since we will re-connect the face ring using the faked subfaces.
        //   We put the adjacent face of [a,b,p] to the list.
        spivot(neighsh, startsh); // The original adjacent subface.
        if (sorg(startsh) != pa) sesymself(startsh);
        sdissolve(startsh);
        // Connect fakesh to the segment [a,b].
        ssbond(startsh, abseg);
        fakesh = startsh; // Do not mark it!
        // Delete the degenerated subface.
        shellfacedealloc(subfaces, neighsh.sh);
      }
      // Save the fakesh in list (for re-creating the face ring).
      cavesegshlist->newindex((void **) &parysh);
      *parysh = fakesh;
    } // i
    caveshlist->restart();

    // Re-create the face ring.
    if (cavesegshlist->objects > 1) {
      for (i = 0; i < cavesegshlist->objects; i++) {
        parysh = (face *) fastlookup(cavesegshlist, i);
        fakesh = *parysh;
        // Get the next face in the ring.
        j = (i + 1) % cavesegshlist->objects;
        parysh = (face *) fastlookup(cavesegshlist, j);
        nextsh = *parysh;
        sbond1(fakesh, nextsh);
      }
    }

    // Delete the two subsegments containing p.
    shellfacedealloc(subsegs, parentseg->sh);
    shellfacedealloc(subsegs, prevseg.sh);
    // Return the new segment.
    *parentseg = abseg;
  } else {
    // p is inside the surface.
    if (b->verbose > 2) {
      printf("      Remove vertex %d from surface.\n", pointmark(delpt));
    }
    // Let 'delpt' be its apex.
    senextself(*parentsh);
    // For unifying the code, we add parentsh to list.
    cavesegshlist->newindex((void **) &parysh);
    *parysh = *parentsh;
  }

  // Remove the point (p).

  for (it = 0; it < cavesegshlist->objects; it++) {
    parentsh = (face *) fastlookup(cavesegshlist, it); // [a,b,p]
    senextself(*parentsh); // [b,p,a].
    spivotself(*parentsh);
    if (sorg(*parentsh) != delpt) sesymself(*parentsh);
    // now parentsh is [p,b,#].
    if (sorg(*parentsh) != delpt) {
      // The vertex has already been removed in above special case.
      continue;
    }

    while (1) {      
      // Initialize the flip edge list. Re-use 'caveshlist'.
      spinsh = *parentsh; // [p, b, #]
      while (1) {
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        senext2self(spinsh);
        spivotself(spinsh);
        if (spinsh.sh == parentsh->sh) break;
        if (sorg(spinsh) != delpt) sesymself(spinsh);
      } // while (1)

      if (caveshlist->objects == 3) {
        // Delete the point by a 3-to-1 flip.
        for (i = 0; i < 3; i++) {
          parysh = (face *) fastlookup(caveshlist, i);
          flipfaces[i] = *parysh;
        }
        flip31(flipfaces, lawson);
        for (i = 0; i < 3; i++) { 
          shellfacedealloc(subfaces, flipfaces[i].sh);
        }
        caveshlist->restart();
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[3];
        // The vertex is removed.
        break;
      }

      // Search an edge to flip.
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) 
          sesymself(flipfaces[1]);
        // Skip this edge if it belongs to a faked subface.
        if (!smarktested(flipfaces[0]) && !smarktested(flipfaces[1])) {
          pa = sorg(flipfaces[0]);
          pb = sdest(flipfaces[0]);
          pc = sapex(flipfaces[0]);
          pd = sapex(flipfaces[1]);
          calculateabovepoint4(pa, pb, pc, pd);
          // Check if a 2-to-2 flip is possible.
          ori1 = orient3d(pc, pd, dummypoint, pa);
          ori2 = orient3d(pc, pd, dummypoint, pb);
          if (ori1 * ori2 < 0) {
            // A 2-to-2 flip is found.
            flip22(flipfaces, lawson, 0);
            // The i-th edge is flipped. The i-th and (i-1)-th subfaces are
            //   changed. The 'flipfaces[1]' contains p as its apex.
            senext2(flipfaces[1], *parentsh);
            // Save the new subface.
            caveshbdlist->newindex((void **) &parysh);
            *parysh = flipfaces[0];
            break;
          }
        } //
      } // i

      if (i == caveshlist->objects) {
        // Do a flip22 and a flip31 to remove p.
        parysh = (face *) fastlookup(caveshlist, 0);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) {
          sesymself(flipfaces[1]);
        }
        flip22(flipfaces, lawson, 0);
        senext2(flipfaces[1], *parentsh);
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[0];
      }

      // The edge list at p are changed.
      caveshlist->restart();
    } // while (1)

  } // it

  cavesegshlist->restart();

  if (b->verbose > 2) {
    printf("      Created %ld new subfaces.\n", caveshbdlist->objects);
  }


  if (lawson) {
    lawsonflip();
  }

  return 0;
}